

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_clear(nk_context *ctx)

{
  nk_size *pnVar1;
  nk_size nVar2;
  nk_window *pnVar3;
  nk_page_element *pnVar4;
  nk_table *pnVar5;
  nk_page_element *elem;
  nk_size nVar6;
  nk_page_element *__s;
  nk_command_buffer *__s_00;
  nk_window *win;
  nk_page_data *pd;
  ulong uVar7;
  ulong uVar8;
  
  if (ctx != (nk_context *)0x0) {
    if (ctx->use_pool == 0) {
      nVar2 = (ctx->memory).marker[0].offset;
      pnVar1 = &(ctx->memory).needed;
      *pnVar1 = *pnVar1 + (nVar2 - (ctx->memory).allocated);
      nVar6 = 0;
      if ((ctx->memory).marker[0].active != 0) {
        nVar6 = nVar2;
      }
      (ctx->memory).allocated = nVar6;
      (ctx->memory).marker[0].active = 0;
    }
    else {
      (ctx->memory).allocated = 0;
      (ctx->memory).size = (ctx->memory).memory.size;
      (ctx->memory).needed = 0;
      (ctx->memory).calls = 0;
    }
    ctx->build = 0;
    (ctx->memory).calls = 0;
    ctx->last_widget_state = 0;
    (ctx->style).cursor_active = (ctx->style).cursors[0];
    __s_00 = &ctx->overlay;
    uVar7 = (ulong)__s_00 & 3;
    if (uVar7 == 0) {
      uVar8 = 0x40;
    }
    else {
      memset(__s_00,0,4 - uVar7);
      uVar8 = uVar7 | 0x3c;
      __s_00 = (nk_command_buffer *)((long)__s_00 + (4 - uVar7));
    }
    uVar7 = (ulong)((uint)uVar8 & 0xfffffffc);
    memset(__s_00,0,uVar7);
    if ((uVar8 & 3) != 0) {
      memset((void *)((long)&__s_00->base + uVar7),0,uVar8 & 3);
    }
    win = ctx->begin;
    while (win != (nk_window *)0x0) {
      if ((win->flags & 0x4000) == 0) {
        pnVar3 = (win->popup).win;
        if ((pnVar3 != (nk_window *)0x0) && (pnVar3->seq != ctx->seq)) {
          nk_free_window(ctx,pnVar3);
          (win->popup).win = (nk_window *)0x0;
        }
        pnVar4 = (nk_page_element *)win->tables;
        while (elem = pnVar4, elem != (nk_page_element *)0x0) {
          pnVar4 = (nk_page_element *)(elem->data).tbl.next;
          if ((elem->data).tbl.seq != ctx->seq) {
            if ((nk_page_element *)win->tables == elem) {
              win->tables = (nk_table *)pnVar4;
            }
            if (pnVar4 != (nk_page_element *)0x0) {
              (pnVar4->data).tbl.prev = (elem->data).tbl.prev;
            }
            pnVar5 = (elem->data).tbl.prev;
            if (pnVar5 != (nk_table *)0x0) {
              pnVar5->next = (nk_table *)pnVar4;
            }
            (elem->data).tbl.next = (nk_table *)0x0;
            (elem->data).tbl.prev = (nk_table *)0x0;
            uVar7 = (ulong)elem & 3;
            if (uVar7 == 0) {
              uVar8 = 0x1b8;
              __s = elem;
            }
            else {
              memset(elem,0,4 - uVar7);
              uVar8 = uVar7 | 0x1b4;
              __s = (nk_page_element *)((4 - uVar7) + (long)elem);
            }
            uVar7 = (ulong)((uint)uVar8 & 0xfffffffc);
            memset(__s,0,uVar7);
            if ((uVar8 & 3) != 0) {
              memset((void *)((long)&__s->data + uVar7),0,uVar8 & 3);
            }
            nk_free_page_element(ctx,elem);
            if (elem == (nk_page_element *)win->tables) {
              win->tables = (nk_table *)pnVar4;
            }
          }
        }
        if ((win->seq == ctx->seq) && ((win->flags & 0x2000) == 0)) goto LAB_0010e8a5;
        pnVar3 = win->next;
        nk_remove_window(ctx,win);
        nk_free_window(ctx,win);
        win = pnVar3;
      }
      else {
LAB_0010e8a5:
        win = win->next;
      }
    }
    ctx->seq = ctx->seq + 1;
  }
  return;
}

Assistant:

NK_API void
nk_clear(struct nk_context *ctx)
{
    struct nk_window *iter;
    struct nk_window *next;
    NK_ASSERT(ctx);

    if (!ctx) return;
    if (ctx->use_pool)
        nk_buffer_clear(&ctx->memory);
    else nk_buffer_reset(&ctx->memory, NK_BUFFER_FRONT);

    ctx->build = 0;
    ctx->memory.calls = 0;
    ctx->last_widget_state = 0;
    ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_ARROW];
    NK_MEMSET(&ctx->overlay, 0, sizeof(ctx->overlay));
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
    nk_draw_list_clear(&ctx->draw_list);
#endif

    /* garbage collector */
    iter = ctx->begin;
    while (iter) {
        /* make sure minimized windows do not get removed */
        if (iter->flags & NK_WINDOW_MINIMIZED) {
            iter = iter->next;
            continue;
        }

        /* free unused popup windows */
        if (iter->popup.win && iter->popup.win->seq != ctx->seq) {
            nk_free_window(ctx, iter->popup.win);
            iter->popup.win = 0;
        }

        /* remove unused window state tables */
        {struct nk_table *n, *it = iter->tables;
        while (it) {
            n = it->next;
            if (it->seq != ctx->seq) {
                nk_remove_table(iter, it);
                nk_zero(it, sizeof(union nk_page_data));
                nk_free_table(ctx, it);
                if (it == iter->tables)
                    iter->tables = n;
            }
            it = n;
        }}

        /* window itself is not used anymore so free */
        if (iter->seq != ctx->seq || iter->flags & NK_WINDOW_CLOSED) {
            next = iter->next;
            nk_remove_window(ctx, iter);
            nk_free_window(ctx, iter);
            iter = next;
        } else iter = iter->next;
    }
    ctx->seq++;
}